

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::compute_expert_loss<false>(data *sm,example *ec)

{
  float fVar1;
  float fVar2;
  
  fVar1 = sm->net_feature_weight;
  if (sm->net_weight + fVar1 <= 0.0) {
    sm->net_feature_weight = 1.0;
    fVar2 = sm->feature_pred;
    fVar1 = 1.0;
  }
  else {
    fVar2 = sm->feature_pred * fVar1 + sm->average_pred;
  }
  fVar2 = (1.0 / (sm->net_weight + fVar1)) * fVar2;
  sm->average_pred = fVar2;
  (ec->pred).scalar = fVar2;
  ec->partial_prediction = sm->average_pred;
  return;
}

Assistant:

void compute_expert_loss(data& sm, example& ec)
{
  vw& all = *sm.all;
  // add in the feature-based expert and normalize,
  float label = ec.l.simple.label;

  if (sm.net_weight + sm.net_feature_weight > 0.)
    sm.average_pred += sm.net_feature_weight * sm.feature_pred;
  else
  {
    sm.net_feature_weight = 1.;
    sm.average_pred = sm.feature_pred;
  }
  float inv_weight = 1.0f / (sm.net_weight + sm.net_feature_weight);
  sm.average_pred *= inv_weight;
  ec.pred.scalar = sm.average_pred;
  ec.partial_prediction = sm.average_pred;

  if (is_learn)
  {
    sm.alg_loss += sm.net_feature_weight * all.loss->getLoss(all.sd, sm.feature_pred, label);
    sm.alg_loss *= inv_weight;
  }
}